

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::HttpClient::Response>::~ExceptionOr
          (ExceptionOr<kj::HttpClient::Response> *this)

{
  ExceptionOr<kj::HttpClient::Response> *this_local;
  
  Maybe<kj::HttpClient::Response>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}